

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad>::~TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad> *this,void **vtt)

{
  int iVar1;
  TPZMultiphysicsElement *in_RSI;
  TPZManVector<TPZCompElSide,_5> *in_RDI;
  int ic;
  int nc;
  uint uVar2;
  
  (in_RDI->super_TPZVec<TPZCompElSide>)._vptr_TPZVec = *(_func_int ***)&in_RSI->super_TPZCompEl;
  *(_List_node_base **)
   ((in_RDI->super_TPZVec<TPZCompElSide>)._vptr_TPZVec[-0xc] + -0x20 +
   (long)&in_RDI->fExtAlloc[0].fEl) =
       (in_RSI->fRestraints).
       super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>._M_impl._M_node
       .super__List_node_base._M_next;
  iVar1 = (*(in_RDI->super_TPZVec<TPZCompElSide>)._vptr_TPZVec[0x12])();
  for (uVar2 = 0; (int)uVar2 < iVar1; uVar2 = uVar2 + 1) {
    (*(in_RDI->super_TPZVec<TPZCompElSide>)._vptr_TPZVec[0x15])(in_RDI,(ulong)uVar2);
    TPZConnect::RemoveDepend((TPZConnect *)in_RDI);
  }
  TPZIntQuad::~TPZIntQuad((TPZIntQuad *)0x1b5f1d9);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_RDI);
  TPZManVector<TPZCompElSide,_5>::~TPZManVector(in_RDI);
  TPZMultiphysicsElement::~TPZMultiphysicsElement(in_RSI,(void **)CONCAT44(iVar1,uVar2));
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::~TPZMultiphysicsCompEl(){
    int nc = NConnects();
    for (int ic=0; ic<nc; ic++) {
        Connect(ic).RemoveDepend();
    }
}